

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O3

void __thiscall
Diligent::SerializedShaderImpl::CreateShaderGL
          (SerializedShaderImpl *this,IReferenceCounters *pRefCounters,ShaderCreateInfo *ShaderCI,
          RENDER_DEVICE_TYPE DeviceType,IDataBlob **ppCompilerOutput)

{
  SerializationDeviceImpl *pSVar1;
  IThreadPool *pIVar2;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var3;
  SerializedShaderImpl *pSVar4;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> this_00;
  IMemoryAllocator *RawAllocator;
  tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_> __p_00;
  IReferenceCounters *pSrcPtr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *Args_1;
  RefCountersImpl *this_01;
  pointer __p;
  SerializationDeviceImpl *pSVar6;
  string msg;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_> *local_58
  ;
  SerializedShaderImpl *local_50;
  RefCntAutoPtr<TaskImpl> local_48;
  ShaderCreateInfoWrapper *local_40;
  __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  local_38;
  
  if ((ppCompilerOutput != (IDataBlob **)0x0) && (*ppCompilerOutput != (IDataBlob *)0x0)) {
    ppCompilerOutput = (IDataBlob **)0x0;
  }
  pSVar1 = this->m_pDevice;
  pSVar6 = pSVar1;
  local_50 = this;
  if ((this->m_Shaders)._M_elems[0]._M_t.
      super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl
      != (CompiledShader *)0x0) {
    FormatString<char[57]>
              (&local_80,(char (*) [57])"Shader has already been initialized for this device type");
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CreateShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
               ,0x6f);
    pSVar4 = local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pSVar6 = pSVar4->m_pDevice;
  }
  this_00._M_head_impl = (CompiledShader *)operator_new(0x120);
  ((CompiledShader *)&(this_00._M_head_impl)->_vptr_CompiledShader)->_vptr_CompiledShader =
       (_func_int **)&PTR__CompiledShaderGL_00aebbd0;
  this_00._M_head_impl[1] = (CompiledShader)pSVar6;
  RawAllocator = GetRawAllocator();
  local_40 = (ShaderCreateInfoWrapper *)(this_00._M_head_impl + 2);
  ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(local_40,ShaderCI,RawAllocator);
  ((CreateInfo *)(this_00._M_head_impl + 0x18))->DeviceInfo =
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_DeviceInfo;
  this_00._M_head_impl[0x19] =
       (CompiledShader)
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_AdapterInfo;
  this_00._M_head_impl[0x1a] = (CompiledShader)ppCompilerOutput;
  *(RENDER_DEVICE_TYPE *)(this_00._M_head_impl + 0x1b) = DeviceType;
  local_58 = (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
              *)(this_00._M_head_impl + 0x1c);
  (((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_> *)
   (this_00._M_head_impl + 0x1c))->_M_t).
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i =
       SHADER_STATUS_UNINITIALIZED;
  Args_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this_00._M_head_impl + 0x20);
  (((String *)(this_00._M_head_impl + 0x1e))->_M_dataplus)._M_p = (pointer)Args_1;
  this_00._M_head_impl[0x1f] = (_func_int **)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(this_00._M_head_impl + 0x20))->_M_local_buf[0] = '\0';
  ((RefCntAutoPtr<Diligent::IShader> *)(this_00._M_head_impl + 0x22))->m_pObject = (IShader *)0x0;
  *(bool *)(this_00._M_head_impl + 0x23) = false;
  pIVar2 = (pSVar6->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
           m_pShaderCompilationThreadPool.m_pObject;
  LOCK();
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i = SHADER_STATUS_COMPILING
  ;
  UNLOCK();
  local_60 = Args_1;
  if ((pIVar2 == (IThreadPool *)0x0) ||
     ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == SHADER_COMPILE_FLAG_NONE)) {
    anon_unknown_1::CompiledShaderGL::InitializeSource((CompiledShaderGL *)this_00._M_head_impl);
    anon_unknown_1::CompiledShaderGL::CreateGLShader((CompiledShaderGL *)this_00._M_head_impl);
  }
  else {
    __p_00.
    super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
    .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
          )operator_new(0x18);
    pSrcPtr = (IReferenceCounters *)operator_new(0x30);
    pSrcPtr->_vptr_IReferenceCounters = (_func_int **)&PTR_AddStrongRef_00aea6d0;
    *(undefined4 *)((long)&pSrcPtr[5]._vptr_IReferenceCounters + 4) = 0;
    pSrcPtr[1]._vptr_IReferenceCounters = (_func_int **)0x0;
    pSrcPtr[2]._vptr_IReferenceCounters = (_func_int **)0x0;
    pSrcPtr[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    pSrcPtr[4]._vptr_IReferenceCounters = (_func_int **)0x0;
    *(undefined1 *)&pSrcPtr[5]._vptr_IReferenceCounters = 0;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)malloc(0x28);
    paVar5->_M_allocated_capacity = (size_type)&PTR___cxa_pure_virtual_00aeb378;
    CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>(pSrcPtr);
    (&paVar5->_M_allocated_capacity)[1] = (size_type)pSrcPtr;
    *(undefined1 *)(&paVar5->_M_allocated_capacity + 2) = 0;
    *(undefined8 *)((long)paVar5 + 0x14) = 0x100000000;
    paVar5->_M_allocated_capacity = (size_type)&PTR_QueryInterface_00aebc30;
    (&paVar5->_M_allocated_capacity)[4] = (size_type)this_00._M_head_impl;
    if (*(int *)((long)&pSrcPtr[5]._vptr_IReferenceCounters + 4) != 0) {
      FormatString<char[33]>(&local_80,(char (*) [33])"Object has already been attached");
      Args_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x10d;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"Attach",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x10d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    pSrcPtr[1]._vptr_IReferenceCounters = (_func_int **)&PTR_DestroyObject_00aebcd0;
    pSrcPtr[2]._vptr_IReferenceCounters = (_func_int **)paVar5;
    pSrcPtr[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    LOCK();
    *(undefined4 *)((long)&pSrcPtr[5]._vptr_IReferenceCounters + 4) = 1;
    UNLOCK();
    this_01 = (RefCountersImpl *)(&paVar5->_M_allocated_capacity)[1];
    local_48.m_pObject = (TaskImpl *)paVar5;
    if (this_01 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_80,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this_01 = (RefCountersImpl *)(&paVar5->_M_allocated_capacity)[1];
    }
    RefCountersImpl::AddStrongRef(this_01);
    (*(pIVar2->super_IObject)._vptr_IObject[4])(pIVar2,paVar5,0,0);
    local_48.m_pObject = (TaskImpl *)0x0;
    local_80._M_dataplus._M_p = (pointer)paVar5;
    RefCntAutoPtr<TaskImpl>::~RefCntAutoPtr(&local_48);
    *(undefined4 *)
     __p_00.
     super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
     .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = 1;
    (((SpinLock *)
     ((long)__p_00.
            super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
            .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl + 4))->
    m_IsLocked)._M_base._M_i = false;
    RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
              ((RefCntWeakPtr<Diligent::IAsyncTask> *)
               ((long)__p_00.
                      super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
                      .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl + 8),
               (RefCntAutoPtr<Diligent::IAsyncTask> *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_38._M_t.
      super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
      .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl =
           (tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>)
           (tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>)
           __p_00.
           super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
           .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl;
      (**(code **)(*(_func_int **)local_80._M_dataplus._M_p + 0x10))();
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
    .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl =
         (tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>)
         (_Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)local_58,
          (pointer)__p_00.
                   super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
                   .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_38);
  }
  _Var3._M_head_impl =
       (local_50->m_Shaders)._M_elems[0]._M_t.
       super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       ._M_t.
       super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl;
  (local_50->m_Shaders)._M_elems[0]._M_t.
  super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var3._M_head_impl != (CompiledShader *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_CompiledShader[1])();
  }
  return;
}

Assistant:

void SerializedShaderImpl::CreateShaderGL(IReferenceCounters*     pRefCounters,
                                          const ShaderCreateInfo& ShaderCI,
                                          RENDER_DEVICE_TYPE      DeviceType,
                                          IDataBlob**             ppCompilerOutput) noexcept(false)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        m_pDevice->GetDeviceInfo(),
        m_pDevice->GetAdapterInfo(),
        // Do not overwrite compiler output from other APIs.
        // TODO: collect all outputs.
        ppCompilerOutput == nullptr || *ppCompilerOutput == nullptr ? ppCompilerOutput : nullptr,
    };

    CreateShader<CompiledShaderGL>(DeviceType::OpenGL, pRefCounters, ShaderCI, GLShaderCI, m_pDevice, DeviceType);
}